

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicToricLattice.cpp
# Opt level: O2

int __thiscall
CubicToricLattice::neighbour(CubicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  bool bVar1;
  int iVar2;
  invalid_argument *this_00;
  cartesian4 cVar3;
  cartesian4 local_38;
  
  if ((sign == -1) || (sign == 1)) {
    bVar1 = std::operator==(direction,"x");
    if (!bVar1) {
      bVar1 = std::operator==(direction,"y");
      if (!bVar1) {
        bVar1 = std::operator==(direction,"z");
        if (!bVar1) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Direction must be one of \'x\', \'y\' or \'z\'.");
          goto LAB_00129790;
        }
      }
    }
    cVar3 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
    local_38 = cVar3;
    if (cVar3.w != 1) {
      bVar1 = std::operator==(direction,"x");
      if (bVar1) {
        iVar2 = (this->super_Lattice).l;
        local_38.x = ((cVar3.x + sign) % iVar2 + iVar2) % iVar2;
      }
      else {
        bVar1 = std::operator==(direction,"y");
        if (bVar1) {
          iVar2 = (this->super_Lattice).l;
          local_38.y = ((cVar3.y + sign) % iVar2 + iVar2) % iVar2;
        }
        else {
          bVar1 = std::operator==(direction,"z");
          if (bVar1) {
            iVar2 = (this->super_Lattice).l;
            local_38.z = ((cVar3.z + sign) % iVar2 + iVar2) % iVar2;
          }
        }
      }
      iVar2 = Lattice::coordinateToIndex(&this->super_Lattice,&local_38);
      return iVar2;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cubic lattice doesn\'t contain w=0 vertices.");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Sign must be either 1 or -1.");
  }
LAB_00129790:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = (l + ((coordinate.x + sign) % l)) % l;
        }
        else if (direction == "y")
        {
            coordinate.y = (l + ((coordinate.y + sign) % l)) % l;
        }
        else if (direction == "z")
        {
            coordinate.z = (l + ((coordinate.z + sign) % l)) % l;
        }
    }
    // std::cerr << coordinate << std::endl;
    return coordinateToIndex(coordinate);
}